

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

void __thiscall LineSpecialTable::LineSpecialTable(LineSpecialTable *this)

{
  FLineSpecial **ppFVar1;
  ulong local_38;
  size_t i_2;
  uint i_1;
  ulong local_20;
  size_t i;
  uint max;
  LineSpecialTable *this_local;
  
  TArray<FLineSpecial_*,_FLineSpecial_*>::TArray(&this->LineSpecialsInfo);
  i._4_4_ = 0;
  for (local_20 = 0; local_20 < 0xf7; local_20 = local_20 + 1) {
    if ((int)i._4_4_ < LineSpecialNames[local_20].number) {
      i._4_4_ = LineSpecialNames[local_20].number;
    }
  }
  TArray<FLineSpecial_*,_FLineSpecial_*>::Resize(&this->LineSpecialsInfo,i._4_4_ + 1);
  for (i_2._0_4_ = 0; (uint)i_2 <= i._4_4_; i_2._0_4_ = (uint)i_2 + 1) {
    ppFVar1 = TArray<FLineSpecial_*,_FLineSpecial_*>::operator[]
                        (&this->LineSpecialsInfo,(ulong)(uint)i_2);
    *ppFVar1 = (FLineSpecial *)0x0;
  }
  qsort(LineSpecialNames,0xf7,0x10,lscmp);
  local_38 = 0;
  while( true ) {
    if (0xf6 < local_38) {
      return;
    }
    ppFVar1 = TArray<FLineSpecial_*,_FLineSpecial_*>::operator[]
                        (&this->LineSpecialsInfo,(long)LineSpecialNames[local_38].number);
    if (*ppFVar1 != (FLineSpecial *)0x0) break;
    ppFVar1 = TArray<FLineSpecial_*,_FLineSpecial_*>::operator[]
                        (&this->LineSpecialsInfo,(long)LineSpecialNames[local_38].number);
    *ppFVar1 = LineSpecialNames + local_38;
    local_38 = local_38 + 1;
  }
  __assert_fail("LineSpecialsInfo[LineSpecialNames[i].number] == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_lnspec.cpp"
                ,0xe2e,"LineSpecialTable::LineSpecialTable()");
}

Assistant:

LineSpecialTable()
	{
		unsigned int max = 0;
		for (size_t i = 0; i < countof(LineSpecialNames); ++i)
		{
			if (LineSpecialNames[i].number > (int)max)
				max = LineSpecialNames[i].number;
		}
		LineSpecialsInfo.Resize(max + 1);
		for (unsigned i = 0; i <= max; i++)
		{
			LineSpecialsInfo[i] = NULL;
		}

		qsort(LineSpecialNames, countof(LineSpecialNames), sizeof(FLineSpecial), lscmp);
		for (size_t i = 0; i < countof(LineSpecialNames); ++i)
		{
			assert(LineSpecialsInfo[LineSpecialNames[i].number] == NULL);
			LineSpecialsInfo[LineSpecialNames[i].number] = &LineSpecialNames[i];
		}
	}